

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgstrf.c
# Opt level: O2

void dgstrf(superlu_options_t *options,SuperMatrix *A,int relax,int panel_size,int *etree,void *work
           ,int_t lwork,int *perm_c,int *perm_r,SuperMatrix *L,SuperMatrix *U,GlobalLU_t *Glu,
           SuperLUStat_t *stat,int_t *info)

{
  int iVar1;
  int_t *piVar2;
  int_t *piVar3;
  int iVar4;
  int_t iVar5;
  int_t iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int_t *piVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  superlu_options_t *psVar18;
  superlu_options_t *psVar19;
  int nseg;
  uint local_18c;
  superlu_options_t *local_188;
  ulong local_180;
  int *repfnz;
  int *segrep;
  fact_t local_164;
  uint local_160;
  int nseg1;
  ulong local_158;
  int *local_150;
  int_t *xprune;
  int *local_140;
  int *local_138;
  double *dense;
  int *marker;
  int_t nnzU;
  int_t nnzL;
  int usepr;
  int pivrow;
  int_t nzlumax;
  ulong local_108;
  int_t *local_100;
  double *tempv;
  int_t *xplore;
  int_t *local_e8;
  long local_e0;
  int_t *local_d8;
  int_t *local_d0;
  int *local_c8;
  int *local_c0;
  SuperMatrix *local_b8;
  int *local_b0;
  ulong local_a8;
  int_t *local_a0;
  int_t *local_98;
  double local_90;
  int *panel_lsub;
  int *parent;
  double *dwork;
  int *iwork;
  long local_68;
  int_t *local_60;
  flops_t *local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_180 = CONCAT44(local_180._4_4_,relax);
  local_150 = etree;
  iVar4 = sp_ienv(6);
  local_164 = options->Fact;
  local_90 = options->DiagPivotThresh;
  local_b0 = stat->panel_histo;
  local_58 = stat->ops;
  uVar7 = A->nrow;
  local_158 = (ulong)uVar7;
  local_18c = A->ncol;
  local_160 = local_18c;
  if ((int)uVar7 < (int)local_18c) {
    local_160 = uVar7;
  }
  piVar11 = (int_t *)A->Store;
  lVar13 = *(long *)(piVar11 + 2);
  piVar2 = *(int_t **)(piVar11 + 4);
  local_98 = *(int_t **)(piVar11 + 6);
  local_a0 = *(int_t **)(piVar11 + 8);
  local_108 = (ulong)(uint)panel_size;
  local_b8 = A;
  iVar5 = dLUMemInit(local_164,work,lwork,uVar7,local_18c,*piVar11,panel_size,(double)iVar4,L,U,Glu,
                     &iwork,&dwork);
  uVar14 = local_158;
  *info = iVar5;
  if (iVar5 == 0) {
    local_c0 = Glu->xsup;
    local_c8 = Glu->supno;
    local_d0 = Glu->xlsub;
    local_d8 = Glu->xlusup;
    local_100 = Glu->xusub;
    iVar4 = (int)local_158;
    iVar9 = (int)local_108;
    local_188 = options;
    SetIWork(iVar4,local_18c,iVar9,iwork,&segrep,&parent,&xplore,&repfnz,&panel_lsub,&xprune,&marker
            );
    dSetRWork(iVar4,iVar9,dwork,&dense,&tempv);
    uVar17 = 0;
    usepr = (int)(local_164 == SamePattern_SameRowPerm);
    if (local_164 == SamePattern_SameRowPerm) {
      local_138 = int32Malloc(iVar4);
      uVar10 = 0;
      if (0 < iVar4) {
        uVar10 = uVar14 & 0xffffffff;
      }
      for (uVar14 = 0; uVar10 != uVar14; uVar14 = uVar14 + 1) {
        local_138[perm_r[uVar14]] = (int)uVar14;
      }
    }
    else {
      local_138 = (int *)0x0;
    }
    uVar7 = local_18c;
    local_e0 = (long)(int)local_158;
    local_68 = (long)(int)local_18c;
    local_140 = int32Malloc(local_18c);
    uVar14 = 0;
    if (0 < (int)uVar7) {
      uVar14 = (ulong)uVar7;
    }
    for (; uVar14 != uVar17; uVar17 = uVar17 + 1) {
      local_140[perm_c[uVar17]] = (int)uVar17;
    }
    piVar11 = intMalloc(uVar7);
    if (local_188->SymmetricMode == YES) {
      heap_relax_snode(uVar7,local_150,(int)local_180,marker,piVar11);
    }
    else {
      relax_snode(uVar7,local_150,(int)local_180,marker,piVar11);
    }
    iVar4 = (int)local_158;
    ifill(perm_r,iVar4,-1);
    ifill(marker,iVar4 * 3,-1);
    *local_c8 = -1;
    *local_d8 = 0;
    *local_100 = 0;
    *local_d0 = 0;
    *local_c0 = 0;
    local_60 = piVar11 + 1;
    local_48 = local_e0 * 4;
    local_50 = local_e0 * 8;
    local_180 = 0;
    psVar19 = (superlu_options_t *)0x0;
    local_e8 = piVar11;
    while( true ) {
      piVar11 = local_e8;
      uVar7 = local_160;
      iVar9 = (int)psVar19;
      iVar4 = (int)local_158;
      if ((int)local_160 <= iVar9) break;
      psVar18 = (superlu_options_t *)(long)iVar9;
      iVar15 = local_e8[(long)psVar18];
      if ((int *)(long)iVar15 == (int *)0xffffffffffffffff) {
        uVar7 = (int)local_108 + iVar9;
        if ((int)local_160 <= (int)uVar7) {
          uVar7 = local_160;
        }
        uVar14 = 0;
        do {
          if ((long)(int)uVar7 <= (long)((long)&psVar18->Fact + uVar14 + 1)) {
            uVar7 = (int)uVar14 + iVar9 + 1;
            uVar17 = local_108;
            goto LAB_00102ccf;
          }
          uVar17 = uVar14 + 1;
          lVar12 = (long)&psVar18->Fact + uVar14;
          uVar14 = uVar17;
        } while (local_60[lVar12] == -1);
        uVar7 = iVar9 + (int)uVar17;
LAB_00102ccf:
        iVar15 = local_160 - iVar9;
        if (uVar7 != local_160) {
          iVar15 = (int)uVar17;
        }
        local_188 = (superlu_options_t *)(long)iVar15;
        local_b0[(long)local_188] = local_b0[(long)local_188] + 1;
        local_a8 = (ulong)psVar19 & 0xffffffff;
        dpanel_dfs(iVar4,iVar15,iVar9,local_b8,perm_r,&nseg1,dense,panel_lsub,segrep,repfnz,xprune,
                   marker,parent,xplore,Glu);
        iVar9 = (int)local_a8;
        dpanel_bmod(iVar4,(int)local_188,iVar9,nseg1,dense,tempv,segrep,repfnz,Glu,stat);
        uVar7 = (int)local_188 + iVar9;
        local_188 = (superlu_options_t *)(ulong)uVar7;
        local_150 = (int *)(long)(int)uVar7;
        lVar12 = 0;
        lVar16 = 0;
        for (; psVar19 = local_188, (long)psVar18 < (long)local_150;
            psVar18 = (superlu_options_t *)((long)&psVar18->Fact + 1)) {
          nseg = nseg1;
          iVar9 = (int)psVar18;
          iVar4 = dcolumn_dfs((int)local_158,iVar9,perm_r,&nseg,(int *)((long)panel_lsub + lVar16),
                              segrep,(int *)((long)repfnz + lVar16),xprune,marker,parent,xplore,Glu)
          ;
          *info = iVar4;
          if (iVar4 != 0) {
            return;
          }
          iVar4 = dcolumn_bmod(iVar9,nseg - nseg1,(double *)((long)dense + lVar12),tempv,
                               segrep + nseg1,(int *)((long)repfnz + lVar16),(int)local_a8,Glu,stat)
          ;
          *info = iVar4;
          if (iVar4 != 0) {
            return;
          }
          iVar4 = dcopy_to_ucol(iVar9,nseg,segrep,(int *)((long)repfnz + lVar16),perm_r,
                                (double *)((long)dense + lVar12),Glu);
          *info = iVar4;
          if (iVar4 != 0) {
            return;
          }
          uVar8 = dpivotL(iVar9,local_90,&usepr,perm_r,local_138,local_140,&pivrow,Glu,stat);
          *info = uVar8;
          uVar7 = (uint)local_180;
          if ((uint)local_180 == 0) {
            uVar7 = uVar8;
          }
          local_180 = local_180 & 0xffffffff;
          if (uVar8 != 0) {
            local_180 = (ulong)uVar7;
          }
          dpruneL(iVar9,perm_r,pivrow,nseg,segrep,(int *)((long)repfnz + lVar16),xprune,Glu);
          resetrep_col(nseg,segrep,(int *)((long)repfnz + lVar16));
          lVar16 = lVar16 + local_48;
          lVar12 = lVar12 + local_50;
        }
      }
      else {
        local_b0[(long)(iVar15 - iVar9) + 1] = local_b0[(long)(iVar15 - iVar9) + 1] + 1;
        local_150 = (int *)(long)iVar15;
        iVar5 = dsnode_dfs(iVar9,iVar15,piVar2,local_98,local_a0,xprune,marker,Glu);
        *info = iVar5;
        if (iVar5 != 0) {
          return;
        }
        local_188 = (superlu_options_t *)CONCAT44(local_188._4_4_,local_100[(long)psVar18]);
        iVar5 = local_d8[(long)psVar18];
        local_38 = (long)local_c8[(long)psVar18];
        local_40 = (long)local_c0[local_38];
        iVar4 = local_d0[local_40 + 1];
        iVar1 = local_d0[local_40];
        nzlumax = Glu->nzlumax;
        while (psVar19 = psVar18, nzlumax < (iVar4 - iVar1) * ((iVar15 - iVar9) + 1) + iVar5) {
          iVar6 = dLUMemXpand(iVar9,iVar5,LUSUP,&nzlumax,Glu);
          *info = iVar6;
          if (iVar6 != 0) {
            return;
          }
        }
        while ((long)psVar19 <= (long)local_150) {
          psVar18 = (superlu_options_t *)((long)&psVar19->Fact + 1);
          local_100[(long)((long)&psVar19->Fact + 1)] = (int_t)local_188;
          iVar4 = local_a0[(long)psVar19];
          for (lVar12 = (long)local_98[(long)psVar19]; lVar12 < iVar4; lVar12 = lVar12 + 1) {
            dense[piVar2[lVar12]] = *(double *)(lVar13 + lVar12 * 8);
          }
          dsnode_bmod((int)psVar19,(int)local_38,(int)local_40,dense,tempv,Glu,stat);
          uVar7 = dpivotL((int)psVar19,local_90,&usepr,perm_r,local_138,local_140,&pivrow,Glu,stat);
          *info = uVar7;
          uVar14 = local_180 & 0xffffffff;
          if ((int)local_180 == 0) {
            uVar14 = (ulong)uVar7;
          }
          psVar19 = psVar18;
          local_180 = local_180 & 0xffffffff;
          if (uVar7 != 0) {
            local_180 = uVar14;
          }
        }
      }
    }
    iVar9 = (int)local_180;
    *info = iVar9;
    uVar8 = iVar9 - 1;
    if (iVar9 == 0) {
      uVar8 = local_18c;
    }
    if ((int)uVar8 < iVar4) {
      lVar13 = 0;
      while ((lVar13 < local_e0 && ((int)uVar8 < iVar4))) {
        if (perm_r[lVar13] == -1) {
          perm_r[lVar13] = uVar8;
          uVar8 = uVar8 + 1;
        }
        lVar13 = lVar13 + 1;
      }
    }
    countnz(local_160,xprune,&nnzL,&nnzU,Glu);
    fixupL(uVar7,perm_r,Glu);
    dLUWorkFree(iwork,dwork,Glu);
    superlu_free(xplore);
    superlu_free(xprune);
    if (local_164 == SamePattern_SameRowPerm) {
      piVar2 = (int_t *)L->Store;
      *piVar2 = nnzL;
      piVar2[1] = Glu->supno[local_68];
      piVar3 = Glu->xlusup;
      *(void **)(piVar2 + 2) = Glu->lusup;
      *(int_t **)(piVar2 + 4) = piVar3;
      piVar3 = Glu->xlsub;
      *(int_t **)(piVar2 + 6) = Glu->lsub;
      *(int_t **)(piVar2 + 8) = piVar3;
      piVar2 = (int_t *)U->Store;
      *piVar2 = nnzU;
      piVar3 = Glu->usub;
      *(void **)(piVar2 + 2) = Glu->ucol;
      *(int_t **)(piVar2 + 4) = piVar3;
      *(int_t **)(piVar2 + 6) = Glu->xusub;
    }
    else {
      dCreate_SuperNode_Matrix
                (L,local_b8->nrow,uVar7,nnzL,(double *)Glu->lusup,Glu->xlusup,Glu->lsub,Glu->xlsub,
                 Glu->supno,Glu->xsup,SLU_SC,SLU_D,SLU_TRLU);
      dCreate_CompCol_Matrix
                (U,uVar7,uVar7,nnzU,(double *)Glu->ucol,Glu->usub,Glu->xusub,SLU_NC,SLU_D,SLU_TRU);
    }
    local_58[7] = local_58[0x13] + local_58[0x14] + local_58[7];
    iVar4 = Glu->num_expansions + -1;
    Glu->num_expansions = iVar4;
    stat->expansions = iVar4;
    if (local_164 == SamePattern_SameRowPerm) {
      superlu_free(local_138);
    }
    superlu_free(local_140);
    superlu_free(piVar11);
  }
  return;
}

Assistant:

void
dgstrf (superlu_options_t *options, SuperMatrix *A,
        int relax, int panel_size, int *etree, void *work, int_t lwork,
        int *perm_c, int *perm_r, SuperMatrix *L, SuperMatrix *U,
    	GlobalLU_t *Glu, /* persistent to facilitate multiple factorizations */
        SuperLUStat_t *stat, int_t *info)
{
    /* Local working arrays */
    NCPformat *Astore;
    int       *iperm_r = NULL; /* inverse of perm_r; used when 
                                  options->Fact == SamePattern_SameRowPerm */
    int       *iperm_c; /* inverse of perm_c */
    int       *iwork;
    double    *dwork;
    int	      *segrep, *repfnz, *parent;
    int	      *panel_lsub; /* dense[]/panel_lsub[] pair forms a w-wide SPA */
    int_t     *xprune, *xplore;
    int	      *marker;
    double    *dense, *tempv;
    int       *relax_end;
    double    *a;
    int_t     *asub, *xa_begin, *xa_end;
    int_t     *xlsub, *xlusup, *xusub;
    int       *xsup, *supno;
    int_t     nzlumax;
    double fill_ratio = sp_ienv(6);  /* estimated fill ratio */

    /* Local scalars */
    fact_t    fact = options->Fact;
    double    diag_pivot_thresh = options->DiagPivotThresh;
    int       pivrow;   /* pivotal row number in the original matrix A */
    int       nseg1;	/* no of segments in U-column above panel row jcol */
    int       nseg;	/* no of segments in each U-column */
    register int jcol, jj;
    register int kcol;	/* end column of a relaxed snode */
    register int icol;
    int_t     i, k, iinfo, new_next, nextlu, nextu;
    int       m, n, min_mn, jsupno, fsupc;
    int       w_def;	/* upper bound on panel width */
    int       usepr, iperm_r_allocated = 0;
    int_t     nnzL, nnzU;
    int       *panel_histo = stat->panel_histo;
    flops_t   *ops = stat->ops;

    iinfo    = 0;
    m        = A->nrow;
    n        = A->ncol;
    min_mn   = SUPERLU_MIN(m, n);
    Astore   = A->Store;
    a        = Astore->nzval;
    asub     = Astore->rowind;
    xa_begin = Astore->colbeg;
    xa_end   = Astore->colend;

    /* Allocate storage common to the factor routines */
    *info = dLUMemInit(fact, work, lwork, m, n, Astore->nnz,
                       panel_size, fill_ratio, L, U, Glu, &iwork, &dwork);
    if ( *info ) return;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    xlsub   = Glu->xlsub;
    xlusup  = Glu->xlusup;
    xusub   = Glu->xusub;
    
    SetIWork(m, n, panel_size, iwork, &segrep, &parent, &xplore,
	     &repfnz, &panel_lsub, &xprune, &marker);
    dSetRWork(m, panel_size, dwork, &dense, &tempv);
    
    usepr = (fact == SamePattern_SameRowPerm);
    if ( usepr ) {
	/* Compute the inverse of perm_r */
	iperm_r = (int *) int32Malloc(m);
	for (k = 0; k < m; ++k) iperm_r[perm_r[k]] = k;
	iperm_r_allocated = 1;
    }
    iperm_c = (int *) int32Malloc(n);
    for (k = 0; k < n; ++k) iperm_c[perm_c[k]] = k;

    /* Identify relaxed snodes */
    relax_end = (int *) intMalloc(n);
    if ( options->SymmetricMode == YES ) {
        heap_relax_snode(n, etree, relax, marker, relax_end); 
    } else {
        relax_snode(n, etree, relax, marker, relax_end); 
    }
    
    ifill (perm_r, m, SLU_EMPTY);
    ifill (marker, m * NO_MARKER, SLU_EMPTY);
    supno[0] = -1;
    xsup[0]  = xlsub[0] = xusub[0] = xlusup[0] = 0;
    w_def    = panel_size;

    /* 
     * Work on one "panel" at a time. A panel is one of the following: 
     *	   (a) a relaxed supernode at the bottom of the etree, or
     *	   (b) panel_size contiguous columns, defined by the user
     */
    for (jcol = 0; jcol < min_mn; ) {

	if ( relax_end[jcol] != SLU_EMPTY ) { /* start of a relaxed snode */
   	    kcol = relax_end[jcol];	  /* end of the relaxed snode */
	    panel_histo[kcol-jcol+1]++;

	    /* --------------------------------------
	     * Factorize the relaxed supernode(jcol:kcol) 
	     * -------------------------------------- */
	    /* Determine the union of the row structure of the snode */
	    if ( (*info = dsnode_dfs(jcol, kcol, asub, xa_begin, xa_end,
				    xprune, marker, Glu)) != 0 )
		return;

            nextu    = xusub[jcol];
	    nextlu   = xlusup[jcol];
	    jsupno   = supno[jcol];
	    fsupc    = xsup[jsupno];
	    new_next = nextlu + (xlsub[fsupc+1]-xlsub[fsupc])*(kcol-jcol+1);
	    nzlumax = Glu->nzlumax;
	    while ( new_next > nzlumax ) {
		if ( (*info = dLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu)) )
		    return;
	    }
    
	    for (icol = jcol; icol<= kcol; icol++) {
		xusub[icol+1] = nextu;
		
    		/* Scatter into SPA dense[*] */
    		for (k = xa_begin[icol]; k < xa_end[icol]; k++)
        	    dense[asub[k]] = a[k];

	       	/* Numeric update within the snode */
	        dsnode_bmod(icol, jsupno, fsupc, dense, tempv, Glu, stat);

		if ( (*info = dpivotL(icol, diag_pivot_thresh, &usepr, perm_r,
				      iperm_r, iperm_c, &pivrow, Glu, stat)) )
		    if ( iinfo == 0 ) iinfo = *info;
		
#if ( DEBUGlevel>=2 )
		dprint_lu_col("[1]: ", icol, pivrow, xprune, Glu);
#endif

	    }

	    jcol = icol;

	} else { /* Work on one panel of panel_size columns */
	    
	    /* Adjust panel_size so that a panel won't overlap with the next 
	     * relaxed snode.
	     */
	    panel_size = w_def;
	    for (k = jcol + 1; k < SUPERLU_MIN(jcol+panel_size, min_mn); k++) 
		if ( relax_end[k] != SLU_EMPTY ) {
		    panel_size = k - jcol;
		    break;
		}
	    if ( k == min_mn ) panel_size = min_mn - jcol;
	    panel_histo[panel_size]++;

	    /* symbolic factor on a panel of columns */
	    dpanel_dfs(m, panel_size, jcol, A, perm_r, &nseg1,
		      dense, panel_lsub, segrep, repfnz, xprune,
		      marker, parent, xplore, Glu);
	    
	    /* numeric sup-panel updates in topological order */
	    dpanel_bmod(m, panel_size, jcol, nseg1, dense,
		        tempv, segrep, repfnz, Glu, stat);
	    
	    /* Sparse LU within the panel, and below panel diagonal */
    	    for ( jj = jcol; jj < jcol + panel_size; jj++) {
 		k = (jj - jcol) * m; /* column index for w-wide arrays */

		nseg = nseg1;	/* Begin after all the panel segments */

	    	if ((*info = dcolumn_dfs(m, jj, perm_r, &nseg, &panel_lsub[k],
					segrep, &repfnz[k], xprune, marker,
					parent, xplore, Glu)) != 0) return;

	      	/* Numeric updates */
	    	if ((*info = dcolumn_bmod(jj, (nseg - nseg1), &dense[k],
					 tempv, &segrep[nseg1], &repfnz[k],
					 jcol, Glu, stat)) != 0) return;
		
	        /* Copy the U-segments to ucol[*] */
		if ((*info = dcopy_to_ucol(jj, nseg, segrep, &repfnz[k],
					  perm_r, &dense[k], Glu)) != 0)
		    return;

	    	if ( (*info = dpivotL(jj, diag_pivot_thresh, &usepr, perm_r,
				      iperm_r, iperm_c, &pivrow, Glu, stat)) )
		    if ( iinfo == 0 ) iinfo = *info;

		/* Prune columns (0:jj-1) using column jj */
	    	dpruneL(jj, perm_r, pivrow, nseg, segrep,
                        &repfnz[k], xprune, Glu);

		/* Reset repfnz[] for this column */
	    	resetrep_col (nseg, segrep, &repfnz[k]);
		
#if ( DEBUGlevel>=2 )
		dprint_lu_col("[2]: ", jj, pivrow, xprune, Glu);
#endif

	    }

   	    jcol += panel_size;	/* Move to the next panel */

	} /* else */

    } /* for */

    *info = iinfo;

    /* Complete perm_r[] for rank-deficient or tall-skinny matrices */
    /* k is the rank of U
       pivots have been completed for rows < k
       Now fill in the pivots for rows k to m */
    k = iinfo == 0 ? n : (int)iinfo - 1;
    if (m > k) {
        /* if k == m, then all the row permutations are complete and
           we can short circuit looking through the rest of the vector */
        for (i = 0; i < m && k < m; ++i) {
            if (perm_r[i] == SLU_EMPTY) {
                perm_r[i] = k;
                ++k;
            }

        }
    }
    
    countnz(min_mn, xprune, &nnzL, &nnzU, Glu);
    fixupL(min_mn, perm_r, Glu);

    dLUWorkFree(iwork, dwork, Glu); /* Free work space and compress storage */
    SUPERLU_FREE(xplore);
    SUPERLU_FREE(xprune);

    if ( fact == SamePattern_SameRowPerm ) {
        /* L and U structures may have changed due to possibly different
	   pivoting, even though the storage is available.
	   There could also be memory expansions, so the array locations
           may have changed, */
        ((SCformat *)L->Store)->nnz = nnzL;
	((SCformat *)L->Store)->nsuper = Glu->supno[n];
	((SCformat *)L->Store)->nzval = (double *) Glu->lusup;
	((SCformat *)L->Store)->nzval_colptr = Glu->xlusup;
	((SCformat *)L->Store)->rowind = Glu->lsub;
	((SCformat *)L->Store)->rowind_colptr = Glu->xlsub;
	((NCformat *)U->Store)->nnz = nnzU;
	((NCformat *)U->Store)->nzval = (double *) Glu->ucol;
	((NCformat *)U->Store)->rowind = Glu->usub;
	((NCformat *)U->Store)->colptr = Glu->xusub;
    } else {
        dCreate_SuperNode_Matrix(L, A->nrow, min_mn, nnzL, 
	      (double *) Glu->lusup, Glu->xlusup, 
              Glu->lsub, Glu->xlsub, Glu->supno, Glu->xsup,
              SLU_SC, SLU_D, SLU_TRLU);
    	dCreate_CompCol_Matrix(U, min_mn, min_mn, nnzU, 
	      (double *) Glu->ucol, Glu->usub, Glu->xusub,
              SLU_NC, SLU_D, SLU_TRU);
    }
    
    ops[FACT] += ops[TRSV] + ops[GEMV];	
    stat->expansions = --(Glu->num_expansions);
    
    if ( iperm_r_allocated ) SUPERLU_FREE (iperm_r);
    SUPERLU_FREE (iperm_c);
    SUPERLU_FREE (relax_end);

}